

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::TestNetworkAdapter>::disposeImpl
          (HeapDisposer<capnp::_::(anonymous_namespace)::TestNetworkAdapter> *this,void *pointer)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Rb_tree_node_base *p_Var3;
  char (*in_RCX) [23];
  Exception exception;
  Array<char> local_450;
  Exception local_438;
  Exception local_2e0;
  Exception local_188;
  
  if (pointer != (void *)0x0) {
    Debug::makeDescription<char_const(&)[23]>
              ((String *)&local_450,(Debug *)"\"Network was destroyed.\"","Network was destroyed.",
               in_RCX);
    Exception::Exception
              (&local_438,FAILED,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0xcc,(String *)&local_450);
    Array<char>::~Array(&local_450);
    for (p_Var3 = *(_Rb_tree_node_base **)((long)pointer + 0x30);
        p_Var3 != (_Rb_tree_node_base *)((long)pointer + 0x20);
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      p_Var1 = p_Var3[1]._M_left;
      Exception::Exception(&local_188,&local_438);
      while (p_Var1[0xe]._M_parent != p_Var1[0xd]._M_parent) {
        p_Var2 = (p_Var1[0xd]._M_parent)->_M_parent;
        Exception::Exception(&local_2e0,&local_188);
        (**(code **)(*(long *)p_Var2 + 8))(p_Var2,&local_2e0);
        Exception::~Exception(&local_2e0);
        std::
        deque<kj::Own<kj::PromiseFulfiller<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_>_>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_>_>_>_>
        ::pop_front((deque<kj::Own<kj::PromiseFulfiller<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_>_>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_>_>_>_>
                     *)&p_Var1[0xc]._M_right);
      }
      NullableValue<kj::Exception>::emplace<kj::Exception>
                ((NullableValue<kj::Exception> *)&p_Var1[1]._M_right,&local_188);
      Own<kj::TaskSet>::dispose((Own<kj::TaskSet> *)&p_Var1[0x12]._M_parent);
      Exception::~Exception(&local_188);
    }
    Exception::~Exception(&local_438);
    std::
    deque<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestProvisionId,_capnproto_test::capnp::test::TestRecipientId,_capnproto_test::capnp::test::TestThirdPartyCapId,_capnproto_test::capnp::test::TestJoinResult>::Connection>,_std::allocator<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestProvisionId,_capnproto_test::capnp::test::TestRecipientId,_capnproto_test::capnp::test::TestThirdPartyCapId,_capnproto_test::capnp::test::TestJoinResult>::Connection>_>_>
    ::~deque((deque<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestProvisionId,_capnproto_test::capnp::test::TestRecipientId,_capnproto_test::capnp::test::TestThirdPartyCapId,_capnproto_test::capnp::test::TestJoinResult>::Connection>,_std::allocator<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestProvisionId,_capnproto_test::capnp::test::TestRecipientId,_capnproto_test::capnp::test::TestThirdPartyCapId,_capnproto_test::capnp::test::TestJoinResult>::Connection>_>_>
              *)((long)pointer + 0x98));
    std::
    deque<kj::Own<kj::PromiseFulfiller<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestProvisionId,_capnproto_test::capnp::test::TestRecipientId,_capnproto_test::capnp::test::TestThirdPartyCapId,_capnproto_test::capnp::test::TestJoinResult>::Connection>_>_>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestProvisionId,_capnproto_test::capnp::test::TestRecipientId,_capnproto_test::capnp::test::TestThirdPartyCapId,_capnproto_test::capnp::test::TestJoinResult>::Connection>_>_>_>_>
    ::~deque((deque<kj::Own<kj::PromiseFulfiller<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestProvisionId,_capnproto_test::capnp::test::TestRecipientId,_capnproto_test::capnp::test::TestThirdPartyCapId,_capnproto_test::capnp::test::TestJoinResult>::Connection>_>_>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestProvisionId,_capnproto_test::capnp::test::TestRecipientId,_capnproto_test::capnp::test::TestThirdPartyCapId,_capnproto_test::capnp::test::TestJoinResult>::Connection>_>_>_>_>
              *)((long)pointer + 0x48));
    std::
    map<const_capnp::_::(anonymous_namespace)::TestNetworkAdapter_*,_kj::Own<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl>,_std::less<const_capnp::_::(anonymous_namespace)::TestNetworkAdapter_*>,_std::allocator<std::pair<const_capnp::_::(anonymous_namespace)::TestNetworkAdapter_*const,_kj::Own<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl>_>_>_>
    ::~map((map<const_capnp::_::(anonymous_namespace)::TestNetworkAdapter_*,_kj::Own<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl>,_std::less<const_capnp::_::(anonymous_namespace)::TestNetworkAdapter_*>,_std::allocator<std::pair<const_capnp::_::(anonymous_namespace)::TestNetworkAdapter_*const,_kj::Own<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl>_>_>_>
            *)((long)pointer + 0x18));
  }
  operator_delete(pointer,0xe8);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }